

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_allocator.cpp
# Opt level: O2

void __thiscall
duckdb::TupleDataAllocator::TupleDataAllocator
          (TupleDataAllocator *this,TupleDataAllocator *allocator)

{
  type pTVar1;
  
  this->buffer_manager = allocator->buffer_manager;
  ::std::__shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2> *)&this->layout_ptr,
             (__shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2> *)
             &allocator->layout_ptr);
  pTVar1 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(&this->layout_ptr);
  this->layout = pTVar1;
  (this->partition_index).index = 0xffffffffffffffff;
  (this->row_blocks).super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
  super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_blocks).super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
  super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_blocks).super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
  super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->heap_blocks).super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
  super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heap_blocks).super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
  super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heap_blocks).super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
  super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->chunk_parts).
  super_vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->chunk_parts).
  super_vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chunk_parts).
  super_vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->chunk_part_indices).
  super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->chunk_part_indices).
  super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chunk_part_indices).
  super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

TupleDataAllocator::TupleDataAllocator(TupleDataAllocator &allocator)
    : buffer_manager(allocator.buffer_manager), layout_ptr(allocator.layout_ptr), layout(*layout_ptr) {
}